

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::FillColumnHorizPalCommand::Execute(FillColumnHorizPalCommand *this,DrawerThread *thread)

{
  uint8_t uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  
  iVar2 = (this->super_PalColumnHorizCommand)._yl;
  uVar9 = thread->pass_end_y - iVar2;
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  uVar6 = (this->super_PalColumnHorizCommand)._count;
  if ((int)uVar6 < (int)uVar9) {
    uVar9 = uVar6;
  }
  iVar3 = thread->num_cores;
  uVar6 = thread->pass_start_y - iVar2;
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  iVar8 = (iVar3 - (int)((iVar2 + uVar6) - thread->core) % iVar3) % iVar3;
  uVar4 = (long)(int)((~uVar6 + iVar3 + uVar9) - iVar8) / (long)iVar3;
  if (0 < (int)uVar4) {
    uVar1 = (uint8_t)(this->super_PalColumnHorizCommand)._color;
    puVar5 = thread->dc_temp +
             (ulong)((this->super_PalColumnHorizCommand)._x & 3) +
             (long)((int)(iVar8 + iVar2 + uVar6) / iVar3) * 4;
    if ((uVar4 & 1) != 0) {
      *puVar5 = uVar1;
      puVar5 = puVar5 + 4;
    }
    if ((int)uVar4 != 1) {
      lVar7 = 0;
      do {
        puVar5[lVar7 * 8] = uVar1;
        puVar5[lVar7 * 8 + 4] = uVar1;
        lVar7 = lVar7 + 1;
      } while ((int)((uVar4 & 0xffffffff) >> 1) != (int)lVar7);
    }
  }
  return;
}

Assistant:

void FillColumnHorizPalCommand::Execute(DrawerThread *thread)
	{
		int count = _count;
		uint8_t color = _color;
		uint8_t *dest;

		count = thread->count_for_thread(_yl, count);
		if (count <= 0)
			return;

		int x = _x & 3;
		dest = &thread->dc_temp[x + thread->temp_line_for_thread(_yl) * 4];

		if (count & 1) {
			*dest = color;
			dest += 4;
		}
		if (!(count >>= 1))
			return;
		do {
			dest[0] = color; dest[4] = color;
			dest += 8;
		} while (--count);
	}